

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_257,_true,_embree::avx2::VirtualCurveIntersectorK<4>,_true>::
     occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  vfloat<4> vVar1;
  byte bVar2;
  BVH *bvh;
  size_t sVar3;
  void *pvVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 uVar15;
  undefined8 uVar16;
  vbool<4> vVar17;
  size_t sVar18;
  char cVar19;
  bool bVar20;
  uint uVar21;
  undefined4 uVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  long lVar26;
  size_t sVar27;
  NodeRef root;
  ulong uVar28;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar29;
  NodeRef *pNVar30;
  vint4 ai_1;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 in_ZMM0 [64];
  vint4 ai_3;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  vint4 ai;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  vint4 bi;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  vint4 bi_1;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  vint4 bi_3;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar71;
  float fVar76;
  float fVar77;
  vint4 ai_2;
  float fVar78;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  vint4 bi_2;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  vfloat4 a0;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  vbool<4> terminated;
  undefined4 local_36b8 [4];
  TravRayK<4,_true> tray;
  Precalculations pre;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  uVar16 = mm_lookupmask_ps._8_8_;
  uVar15 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  sVar27 = (bvh->root).ptr;
  if (sVar27 != 8) {
    auVar54 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar43 = vpcmpeqd_avx(auVar54,(undefined1  [16])valid_i->field_0);
    auVar54 = *(undefined1 (*) [16])(ray + 0x80);
    auVar40 = ZEXT816(0) << 0x40;
    auVar47 = vcmpps_avx(auVar54,auVar40,5);
    auVar47 = vandps_avx(auVar47,auVar43);
    uVar24 = vmovmskps_avx(auVar47);
    if (uVar24 != 0) {
      uVar25 = (ulong)(uVar24 & 0xff);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar43._0_4_ = tray.dir.field_0._32_4_ * tray.dir.field_0._32_4_;
      auVar43._4_4_ = tray.dir.field_0._36_4_ * tray.dir.field_0._36_4_;
      auVar43._8_4_ = tray.dir.field_0._40_4_ * tray.dir.field_0._40_4_;
      auVar43._12_4_ = tray.dir.field_0._44_4_ * tray.dir.field_0._44_4_;
      auVar43 = vfmadd231ps_fma(auVar43,(undefined1  [16])tray.dir.field_0.field_0.y.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar64 = vfmadd231ps_fma(auVar43,(undefined1  [16])tray.dir.field_0.field_0.x.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar43 = vrsqrtps_avx(auVar64);
      fVar71 = auVar43._0_4_;
      fVar76 = auVar43._4_4_;
      fVar77 = auVar43._8_4_;
      fVar78 = auVar43._12_4_;
      auVar63._0_4_ = fVar71 * fVar71 * fVar71 * auVar64._0_4_ * -0.5;
      auVar63._4_4_ = fVar76 * fVar76 * fVar76 * auVar64._4_4_ * -0.5;
      auVar63._8_4_ = fVar77 * fVar77 * fVar77 * auVar64._8_4_ * -0.5;
      auVar63._12_4_ = fVar78 * fVar78 * fVar78 * auVar64._12_4_ * -0.5;
      auVar79._8_4_ = 0x3fc00000;
      auVar79._0_8_ = 0x3fc000003fc00000;
      auVar79._12_4_ = 0x3fc00000;
      pre.depth_scale.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vfmadd213ps_fma(auVar79,auVar43,auVar63);
      auVar64._8_4_ = 0x80000000;
      auVar64._0_8_ = 0x8000000080000000;
      auVar64._12_4_ = 0x80000000;
      while (uVar25 != 0) {
        lVar26 = 0;
        for (uVar28 = uVar25; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
          lVar26 = lVar26 + 1;
        }
        uVar28 = (ulong)(uint)((int)lVar26 * 4);
        auVar43 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar28 + 0x40)),
                                ZEXT416(*(uint *)(ray + uVar28 + 0x50)),0x1c);
        auVar43 = vinsertps_avx(auVar43,ZEXT416(*(uint *)(ray + uVar28 + 0x60)),0x28);
        fVar71 = *(float *)((long)pre.ray_space + (uVar28 - 0x10));
        auVar89._0_4_ = auVar43._0_4_ * fVar71;
        auVar89._4_4_ = auVar43._4_4_ * fVar71;
        auVar89._8_4_ = auVar43._8_4_ * fVar71;
        auVar89._12_4_ = auVar43._12_4_ * fVar71;
        auVar63 = vshufpd_avx(auVar89,auVar89,1);
        auVar43 = vmovshdup_avx(auVar89);
        auVar94._0_4_ = auVar43._0_4_ ^ 0x80000000;
        auVar43 = vunpckhps_avx(auVar89,auVar40);
        auVar94._4_12_ = ZEXT812(0) << 0x20;
        auVar85 = vshufps_avx(auVar43,auVar94,0x41);
        auVar91._0_8_ = auVar63._0_8_ ^ 0x8000000080000000;
        auVar91._8_8_ = auVar63._8_8_ ^ auVar64._8_8_;
        auVar79 = vinsertps_avx(auVar91,auVar89,0x2a);
        auVar43 = vdpps_avx(auVar85,auVar85,0x7f);
        auVar63 = vdpps_avx(auVar79,auVar79,0x7f);
        auVar43 = vcmpps_avx(auVar63,auVar43,1);
        auVar97._0_4_ = auVar43._0_4_;
        auVar97._4_4_ = auVar97._0_4_;
        auVar97._8_4_ = auVar97._0_4_;
        auVar97._12_4_ = auVar97._0_4_;
        auVar43 = vblendvps_avx(auVar79,auVar85,auVar97);
        auVar63 = vdpps_avx(auVar43,auVar43,0x7f);
        auVar79 = vrsqrtss_avx(auVar63,auVar63);
        fVar76 = auVar79._0_4_;
        fVar76 = fVar76 * 1.5 - auVar63._0_4_ * 0.5 * fVar76 * fVar76 * fVar76;
        auVar92._0_4_ = auVar43._0_4_ * fVar76;
        auVar92._4_4_ = auVar43._4_4_ * fVar76;
        auVar92._8_4_ = auVar43._8_4_ * fVar76;
        auVar92._12_4_ = auVar43._12_4_ * fVar76;
        auVar43 = vshufps_avx(auVar92,auVar92,0xc9);
        auVar63 = vshufps_avx(auVar89,auVar89,0xc9);
        auVar98._0_4_ = auVar92._0_4_ * auVar63._0_4_;
        auVar98._4_4_ = auVar92._4_4_ * auVar63._4_4_;
        auVar98._8_4_ = auVar92._8_4_ * auVar63._8_4_;
        auVar98._12_4_ = auVar92._12_4_ * auVar63._12_4_;
        auVar43 = vfmsub231ps_fma(auVar98,auVar89,auVar43);
        auVar79 = vshufps_avx(auVar43,auVar43,0xc9);
        auVar43 = vdpps_avx(auVar79,auVar79,0x7f);
        uVar25 = uVar25 - 1 & uVar25;
        auVar63 = vrsqrtss_avx(auVar43,auVar43);
        fVar76 = auVar63._0_4_;
        fVar76 = fVar76 * 1.5 - auVar43._0_4_ * 0.5 * fVar76 * fVar76 * fVar76;
        auVar95._0_4_ = fVar76 * auVar79._0_4_;
        auVar95._4_4_ = fVar76 * auVar79._4_4_;
        auVar95._8_4_ = fVar76 * auVar79._8_4_;
        auVar95._12_4_ = fVar76 * auVar79._12_4_;
        auVar85._0_4_ = fVar71 * auVar89._0_4_;
        auVar85._4_4_ = fVar71 * auVar89._4_4_;
        auVar85._8_4_ = fVar71 * auVar89._8_4_;
        auVar85._12_4_ = fVar71 * auVar89._12_4_;
        auVar79 = vunpcklps_avx(auVar92,auVar85);
        auVar43 = vunpckhps_avx(auVar92,auVar85);
        auVar85 = vunpcklps_avx(auVar95,auVar40);
        auVar63 = vunpckhps_avx(auVar95,auVar40);
        aVar6 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar43,auVar63);
        aVar7 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar79,auVar85);
        aVar5 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar79,auVar85);
        pre.ray_space[lVar26].vx.field_0 = aVar7;
        pre.ray_space[lVar26].vy.field_0 = aVar5;
        pre.ray_space[lVar26].vz.field_0 = aVar6;
      }
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      auVar72._8_4_ = 0x7fffffff;
      auVar72._0_8_ = 0x7fffffff7fffffff;
      auVar72._12_4_ = 0x7fffffff;
      auVar43 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar72);
      auVar80._8_4_ = 0x219392ef;
      auVar80._0_8_ = 0x219392ef219392ef;
      auVar80._12_4_ = 0x219392ef;
      auVar40 = vcmpps_avx(auVar43,auVar80,1);
      auVar86._8_4_ = 0x3f800000;
      auVar86._0_8_ = 0x3f8000003f800000;
      auVar86._12_4_ = 0x3f800000;
      auVar63 = vdivps_avx(auVar86,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar43 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar72);
      auVar64 = vcmpps_avx(auVar43,auVar80,1);
      auVar79 = vdivps_avx(auVar86,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar43 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar72);
      auVar43 = vcmpps_avx(auVar43,auVar80,1);
      auVar81._8_4_ = 0x5d5e0b6b;
      auVar81._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar81._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar63,auVar81,auVar40);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar79,auVar81,auVar64);
      auVar40 = vdivps_avx(auVar86,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar40,auVar81,auVar43);
      auVar40 = ZEXT816(0) << 0x20;
      auVar43 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar40,1);
      auVar65._8_4_ = 0x20;
      auVar65._0_8_ = 0x2000000020;
      auVar65._12_4_ = 0x20;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar43,auVar65);
      auVar43 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar40,5);
      auVar66._8_4_ = 0x40;
      auVar66._0_8_ = 0x4000000040;
      auVar66._12_4_ = 0x40;
      auVar73._8_4_ = 0x60;
      auVar73._0_8_ = 0x6000000060;
      auVar73._12_4_ = 0x60;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar73,auVar66,auVar43);
      auVar43 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar40,5);
      auVar48._8_4_ = 0x80;
      auVar48._0_8_ = 0x8000000080;
      auVar48._12_4_ = 0x80;
      auVar55._8_4_ = 0xa0;
      auVar55._0_8_ = 0xa0000000a0;
      auVar55._12_4_ = 0xa0;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar55,auVar48,auVar43);
      auVar43 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar40);
      auVar54 = vmaxps_avx(auVar54,auVar40);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar99 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar43,auVar47);
      auVar40._8_4_ = 0xff800000;
      auVar40._0_8_ = 0xff800000ff800000;
      auVar40._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar40,auVar54,auVar47);
      auVar54 = vpcmpeqd_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])tray.tfar.field_0
                            );
      terminated.field_0._0_4_ = auVar47._0_4_ ^ auVar54._0_4_;
      terminated.field_0._4_4_ = auVar47._4_4_ ^ auVar54._4_4_;
      terminated.field_0._8_4_ = auVar47._8_4_ ^ auVar54._8_4_;
      terminated.field_0._12_4_ = auVar47._12_4_ ^ auVar54._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar24 = 3;
      }
      else {
        uVar24 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar30 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar29 = &stack_near[2].field_0;
      stack_node[1].ptr = sVar27;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
LAB_01646779:
      do {
        do {
          root.ptr = pNVar30[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01646d4f;
          pNVar30 = pNVar30 + -1;
          paVar29 = paVar29 + -1;
          vVar1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar29->v;
          auVar100 = ZEXT1664((undefined1  [16])vVar1.field_0);
          auVar54 = vcmpps_avx((undefined1  [16])vVar1.field_0,(undefined1  [16])tray.tfar.field_0,1
                              );
          uVar21 = vmovmskps_avx(auVar54);
        } while (uVar21 == 0);
        uVar25 = (ulong)(uVar21 & 0xff);
        uVar21 = POPCOUNT(uVar21 & 0xff);
        if (uVar24 < uVar21) {
LAB_016467b7:
          do {
            vVar17.field_0 = terminated.field_0;
            sVar27 = 8;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01646d4f;
              auVar54 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar100._0_16_,6);
              if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar54[0xf] < '\0') {
                bVar2 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                pvVar4 = This->leafIntersector;
                local_36b8._0_8_ = uVar15;
                local_36b8._8_8_ = uVar16;
                uVar21 = vmovmskps_avx((undefined1  [16])terminated.field_0);
                uVar25 = (ulong)(uVar21 ^ 0xf);
                while (uVar25 != 0) {
                  lVar26 = 0;
                  for (uVar28 = uVar25; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000
                      ) {
                    lVar26 = lVar26 + 1;
                  }
                  uVar25 = uVar25 - 1 & uVar25;
                  cVar19 = (**(code **)((long)pvVar4 + (ulong)bVar2 * 0x40 + 0x18))
                                     (&pre,ray,lVar26,context,
                                      (byte *)(root.ptr & 0xfffffffffffffff0));
                  auVar99 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                  if (cVar19 != '\0') {
                    local_36b8[lVar26] = 0xffffffff;
                  }
                }
                auVar8._8_4_ = local_36b8[2];
                auVar8._12_4_ = local_36b8[3];
                auVar8._0_4_ = local_36b8[0];
                auVar8._4_4_ = local_36b8[1];
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     vorps_avx((undefined1  [16])vVar17.field_0,auVar8);
                auVar54 = _DAT_01f46b70 & ~(undefined1  [16])terminated.field_0;
                if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar54 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar54 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar54[0xf]) goto LAB_01646d4f;
                auVar53._8_4_ = 0xff800000;
                auVar53._0_8_ = 0xff800000ff800000;
                auVar53._12_4_ = 0xff800000;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar53,
                                   (undefined1  [16])terminated.field_0);
              }
              goto LAB_01646779;
            }
            uVar25 = root.ptr & 0xfffffffffffffff0;
            auVar54 = auVar99._0_16_;
            for (lVar26 = 0x38;
                (auVar100 = ZEXT1664(auVar54), lVar26 != 0x40 &&
                (sVar3 = *(size_t *)((uVar25 - 0x1c0) + lVar26 * 8), sVar3 != 8));
                lVar26 = lVar26 + 1) {
              if ((root.ptr & 7) == 0) {
                uVar22 = *(undefined4 *)((root.ptr - 0xa0) + lVar26 * 4);
                auVar31._4_4_ = uVar22;
                auVar31._0_4_ = uVar22;
                auVar31._8_4_ = uVar22;
                auVar31._12_4_ = uVar22;
                auVar9._8_8_ = tray.org.field_0._8_8_;
                auVar9._0_8_ = tray.org.field_0._0_8_;
                auVar11._8_8_ = tray.org.field_0._24_8_;
                auVar11._0_8_ = tray.org.field_0._16_8_;
                auVar13._8_8_ = tray.org.field_0._40_8_;
                auVar13._0_8_ = tray.org.field_0._32_8_;
                auVar43 = vsubps_avx(auVar31,auVar9);
                auVar67._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar43._0_4_;
                auVar67._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar43._4_4_;
                auVar67._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar43._8_4_;
                auVar67._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar43._12_4_;
                uVar22 = *(undefined4 *)((root.ptr - 0x60) + lVar26 * 4);
                auVar32._4_4_ = uVar22;
                auVar32._0_4_ = uVar22;
                auVar32._8_4_ = uVar22;
                auVar32._12_4_ = uVar22;
                auVar43 = vsubps_avx(auVar32,auVar11);
                auVar82._0_4_ = tray.rdir.field_0._16_4_ * auVar43._0_4_;
                auVar82._4_4_ = tray.rdir.field_0._20_4_ * auVar43._4_4_;
                auVar82._8_4_ = tray.rdir.field_0._24_4_ * auVar43._8_4_;
                auVar82._12_4_ = tray.rdir.field_0._28_4_ * auVar43._12_4_;
                uVar22 = *(undefined4 *)((root.ptr - 0x20) + lVar26 * 4);
                auVar33._4_4_ = uVar22;
                auVar33._0_4_ = uVar22;
                auVar33._8_4_ = uVar22;
                auVar33._12_4_ = uVar22;
                auVar43 = vsubps_avx(auVar33,auVar13);
                auVar90._0_4_ = tray.rdir.field_0._32_4_ * auVar43._0_4_;
                auVar90._4_4_ = tray.rdir.field_0._36_4_ * auVar43._4_4_;
                auVar90._8_4_ = tray.rdir.field_0._40_4_ * auVar43._8_4_;
                auVar90._12_4_ = tray.rdir.field_0._44_4_ * auVar43._12_4_;
                uVar22 = *(undefined4 *)((root.ptr - 0x80) + lVar26 * 4);
                auVar34._4_4_ = uVar22;
                auVar34._0_4_ = uVar22;
                auVar34._8_4_ = uVar22;
                auVar34._12_4_ = uVar22;
                auVar43 = vsubps_avx(auVar34,auVar9);
                auVar41._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar43._0_4_;
                auVar41._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar43._4_4_;
                auVar41._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar43._8_4_;
                auVar41._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar43._12_4_;
                uVar22 = *(undefined4 *)((root.ptr - 0x40) + lVar26 * 4);
                auVar35._4_4_ = uVar22;
                auVar35._0_4_ = uVar22;
                auVar35._8_4_ = uVar22;
                auVar35._12_4_ = uVar22;
                auVar43 = vsubps_avx(auVar35,auVar11);
                auVar49._0_4_ = tray.rdir.field_0._16_4_ * auVar43._0_4_;
                auVar49._4_4_ = tray.rdir.field_0._20_4_ * auVar43._4_4_;
                auVar49._8_4_ = tray.rdir.field_0._24_4_ * auVar43._8_4_;
                auVar49._12_4_ = tray.rdir.field_0._28_4_ * auVar43._12_4_;
                uVar22 = *(undefined4 *)(root.ptr + lVar26 * 4);
                auVar36._4_4_ = uVar22;
                auVar36._0_4_ = uVar22;
                auVar36._8_4_ = uVar22;
                auVar36._12_4_ = uVar22;
                auVar43 = vsubps_avx(auVar36,auVar13);
                auVar56._0_4_ = tray.rdir.field_0._32_4_ * auVar43._0_4_;
                auVar56._4_4_ = tray.rdir.field_0._36_4_ * auVar43._4_4_;
                auVar56._8_4_ = tray.rdir.field_0._40_4_ * auVar43._8_4_;
                auVar56._12_4_ = tray.rdir.field_0._44_4_ * auVar43._12_4_;
                auVar43 = vminps_avx(auVar67,auVar41);
                auVar40 = vminps_avx(auVar82,auVar49);
                auVar43 = vmaxps_avx(auVar43,auVar40);
                auVar40 = vminps_avx(auVar90,auVar56);
                auVar43 = vmaxps_avx(auVar43,auVar40);
                auVar37._0_4_ = auVar43._0_4_ * 0.99999964;
                auVar37._4_4_ = auVar43._4_4_ * 0.99999964;
                auVar37._8_4_ = auVar43._8_4_ * 0.99999964;
                auVar37._12_4_ = auVar43._12_4_ * 0.99999964;
                auVar43 = vmaxps_avx(auVar67,auVar41);
                auVar40 = vmaxps_avx(auVar82,auVar49);
                auVar40 = vminps_avx(auVar43,auVar40);
                auVar43 = vmaxps_avx(auVar90,auVar56);
                auVar40 = vminps_avx(auVar40,auVar43);
                auVar43 = vmaxps_avx(auVar37,(undefined1  [16])tray.tnear.field_0);
                auVar42._0_4_ = auVar40._0_4_ * 1.0000004;
                auVar42._4_4_ = auVar40._4_4_ * 1.0000004;
                auVar42._8_4_ = auVar40._8_4_ * 1.0000004;
                auVar42._12_4_ = auVar40._12_4_ * 1.0000004;
                auVar40 = vminps_avx(auVar42,(undefined1  [16])tray.tfar.field_0);
              }
              else {
                uVar22 = *(undefined4 *)((uVar25 - 0x40) + lVar26 * 4);
                auVar68._4_4_ = uVar22;
                auVar68._0_4_ = uVar22;
                auVar68._8_4_ = uVar22;
                auVar68._12_4_ = uVar22;
                uVar22 = *(undefined4 *)((uVar25 - 0x20) + lVar26 * 4);
                auVar60._4_4_ = uVar22;
                auVar60._0_4_ = uVar22;
                auVar60._8_4_ = uVar22;
                auVar60._12_4_ = uVar22;
                uVar22 = *(undefined4 *)(uVar25 + lVar26 * 4);
                auVar57._4_4_ = uVar22;
                auVar57._0_4_ = uVar22;
                auVar57._8_4_ = uVar22;
                auVar57._12_4_ = uVar22;
                fVar71 = *(float *)(uVar25 + 0x20 + lVar26 * 4);
                auVar74._4_4_ = fVar71;
                auVar74._0_4_ = fVar71;
                auVar74._8_4_ = fVar71;
                auVar74._12_4_ = fVar71;
                fVar76 = *(float *)(uVar25 + 0x40 + lVar26 * 4);
                auVar83._4_4_ = fVar76;
                auVar83._0_4_ = fVar76;
                auVar83._8_4_ = fVar76;
                auVar83._12_4_ = fVar76;
                fVar77 = *(float *)(uVar25 + 0x60 + lVar26 * 4);
                auVar87._4_4_ = fVar77;
                auVar87._0_4_ = fVar77;
                auVar87._8_4_ = fVar77;
                auVar87._12_4_ = fVar77;
                uVar22 = *(undefined4 *)(uVar25 + 0x80 + lVar26 * 4);
                auVar51._4_4_ = uVar22;
                auVar51._0_4_ = uVar22;
                auVar51._8_4_ = uVar22;
                auVar51._12_4_ = uVar22;
                uVar22 = *(undefined4 *)(uVar25 + 0xa0 + lVar26 * 4);
                auVar38._4_4_ = uVar22;
                auVar38._0_4_ = uVar22;
                auVar38._8_4_ = uVar22;
                auVar38._12_4_ = uVar22;
                uVar22 = *(undefined4 *)(uVar25 + 0xc0 + lVar26 * 4);
                auVar44._4_4_ = uVar22;
                auVar44._0_4_ = uVar22;
                auVar44._8_4_ = uVar22;
                auVar44._12_4_ = uVar22;
                auVar14._8_8_ = tray.org.field_0._40_8_;
                auVar14._0_8_ = tray.org.field_0._32_8_;
                auVar43 = vfmadd231ps_fma(auVar51,auVar14,auVar74);
                auVar40 = vfmadd231ps_fma(auVar38,auVar14,auVar83);
                auVar64 = vfmadd231ps_fma(auVar44,auVar14,auVar87);
                auVar75._0_4_ = (float)tray.dir.field_0._32_4_ * fVar71;
                auVar75._4_4_ = (float)tray.dir.field_0._36_4_ * fVar71;
                auVar75._8_4_ = (float)tray.dir.field_0._40_4_ * fVar71;
                auVar75._12_4_ = (float)tray.dir.field_0._44_4_ * fVar71;
                auVar84._0_4_ = (float)tray.dir.field_0._32_4_ * fVar76;
                auVar84._4_4_ = (float)tray.dir.field_0._36_4_ * fVar76;
                auVar84._8_4_ = (float)tray.dir.field_0._40_4_ * fVar76;
                auVar84._12_4_ = (float)tray.dir.field_0._44_4_ * fVar76;
                auVar88._0_4_ = fVar77 * (float)tray.dir.field_0._32_4_;
                auVar88._4_4_ = fVar77 * (float)tray.dir.field_0._36_4_;
                auVar88._8_4_ = fVar77 * (float)tray.dir.field_0._40_4_;
                auVar88._12_4_ = fVar77 * (float)tray.dir.field_0._44_4_;
                auVar63 = vfmadd231ps_fma(auVar75,(undefined1  [16])
                                                  tray.dir.field_0.field_0.y.field_0,auVar68);
                auVar79 = vfmadd231ps_fma(auVar84,(undefined1  [16])
                                                  tray.dir.field_0.field_0.y.field_0,auVar60);
                auVar85 = vfmadd231ps_fma(auVar88,auVar57,
                                          (undefined1  [16])tray.dir.field_0.field_0.y.field_0);
                auVar12._8_8_ = tray.org.field_0._24_8_;
                auVar12._0_8_ = tray.org.field_0._16_8_;
                auVar89 = vfmadd231ps_fma(auVar43,auVar12,auVar68);
                uVar22 = *(undefined4 *)((uVar25 - 0xa0) + lVar26 * 4);
                auVar69._4_4_ = uVar22;
                auVar69._0_4_ = uVar22;
                auVar69._8_4_ = uVar22;
                auVar69._12_4_ = uVar22;
                auVar91 = vfmadd231ps_fma(auVar40,auVar12,auVar60);
                uVar22 = *(undefined4 *)((uVar25 - 0x80) + lVar26 * 4);
                auVar61._4_4_ = uVar22;
                auVar61._0_4_ = uVar22;
                auVar61._8_4_ = uVar22;
                auVar61._12_4_ = uVar22;
                auVar92 = vfmadd231ps_fma(auVar64,auVar12,auVar57);
                uVar22 = *(undefined4 *)((uVar25 - 0x60) + lVar26 * 4);
                auVar58._4_4_ = uVar22;
                auVar58._0_4_ = uVar22;
                auVar58._8_4_ = uVar22;
                auVar58._12_4_ = uVar22;
                auVar40 = vfmadd231ps_fma(auVar63,(undefined1  [16])
                                                  tray.dir.field_0.field_0.x.field_0,auVar69);
                auVar64 = vfmadd231ps_fma(auVar79,(undefined1  [16])
                                                  tray.dir.field_0.field_0.x.field_0,auVar61);
                auVar63 = vfmadd231ps_fma(auVar85,auVar58,
                                          (undefined1  [16])tray.dir.field_0.field_0.x.field_0);
                auVar43 = vandps_avx(auVar72,auVar40);
                auVar96._8_4_ = 0x219392ef;
                auVar96._0_8_ = 0x219392ef219392ef;
                auVar96._12_4_ = 0x219392ef;
                auVar43 = vcmpps_avx(auVar43,auVar96,1);
                auVar40 = vblendvps_avx(auVar40,auVar96,auVar43);
                auVar43 = vandps_avx(auVar72,auVar64);
                auVar43 = vcmpps_avx(auVar43,auVar96,1);
                auVar64 = vblendvps_avx(auVar64,auVar96,auVar43);
                auVar43 = vandps_avx(auVar63,auVar72);
                auVar43 = vcmpps_avx(auVar43,auVar96,1);
                auVar43 = vblendvps_avx(auVar63,auVar96,auVar43);
                auVar63 = vrcpps_avx(auVar40);
                auVar93._8_4_ = 0x3f800000;
                auVar93._0_8_ = 0x3f8000003f800000;
                auVar93._12_4_ = 0x3f800000;
                auVar40 = vfnmadd213ps_fma(auVar40,auVar63,auVar93);
                auVar63 = vfmadd132ps_fma(auVar40,auVar63,auVar63);
                auVar40 = vrcpps_avx(auVar64);
                auVar64 = vfnmadd213ps_fma(auVar64,auVar40,auVar93);
                auVar64 = vfmadd132ps_fma(auVar64,auVar40,auVar40);
                auVar40 = vrcpps_avx(auVar43);
                auVar43 = vfnmadd213ps_fma(auVar43,auVar40,auVar93);
                auVar43 = vfmadd132ps_fma(auVar43,auVar40,auVar40);
                auVar10._8_8_ = tray.org.field_0._8_8_;
                auVar10._0_8_ = tray.org.field_0._0_8_;
                auVar40 = vfmadd231ps_fma(auVar89,auVar10,auVar69);
                auVar79 = vfmadd231ps_fma(auVar91,auVar10,auVar61);
                auVar85 = vfmadd231ps_fma(auVar92,auVar10,auVar58);
                auVar52._0_4_ = auVar40._0_4_ * -auVar63._0_4_;
                auVar52._4_4_ = auVar40._4_4_ * -auVar63._4_4_;
                auVar52._8_4_ = auVar40._8_4_ * -auVar63._8_4_;
                auVar52._12_4_ = auVar40._12_4_ * -auVar63._12_4_;
                auVar39._0_4_ = auVar79._0_4_ * -auVar64._0_4_;
                auVar39._4_4_ = auVar79._4_4_ * -auVar64._4_4_;
                auVar39._8_4_ = auVar79._8_4_ * -auVar64._8_4_;
                auVar39._12_4_ = auVar79._12_4_ * -auVar64._12_4_;
                auVar45._0_4_ = auVar85._0_4_ * -auVar43._0_4_;
                auVar45._4_4_ = auVar85._4_4_ * -auVar43._4_4_;
                auVar45._8_4_ = auVar85._8_4_ * -auVar43._8_4_;
                auVar45._12_4_ = auVar85._12_4_ * -auVar43._12_4_;
                auVar59._0_4_ = auVar63._0_4_ + auVar52._0_4_;
                auVar59._4_4_ = auVar63._4_4_ + auVar52._4_4_;
                auVar59._8_4_ = auVar63._8_4_ + auVar52._8_4_;
                auVar59._12_4_ = auVar63._12_4_ + auVar52._12_4_;
                auVar62._0_4_ = auVar64._0_4_ + auVar39._0_4_;
                auVar62._4_4_ = auVar64._4_4_ + auVar39._4_4_;
                auVar62._8_4_ = auVar64._8_4_ + auVar39._8_4_;
                auVar62._12_4_ = auVar64._12_4_ + auVar39._12_4_;
                auVar70._0_4_ = auVar43._0_4_ + auVar45._0_4_;
                auVar70._4_4_ = auVar43._4_4_ + auVar45._4_4_;
                auVar70._8_4_ = auVar43._8_4_ + auVar45._8_4_;
                auVar70._12_4_ = auVar43._12_4_ + auVar45._12_4_;
                auVar43 = vpminsd_avx(auVar52,auVar59);
                auVar40 = vpminsd_avx(auVar39,auVar62);
                auVar43 = vpmaxsd_avx(auVar43,auVar40);
                auVar40 = vpminsd_avx(auVar45,auVar70);
                auVar43 = vpmaxsd_avx(auVar43,auVar40);
                auVar40 = vpmaxsd_avx(auVar52,auVar59);
                auVar64 = vpmaxsd_avx(auVar39,auVar62);
                auVar64 = vpminsd_avx(auVar40,auVar64);
                auVar40 = vpmaxsd_avx(auVar45,auVar70);
                auVar40 = vpminsd_avx(auVar64,auVar40);
                auVar37._0_4_ = auVar43._0_4_ * 0.99999964;
                auVar37._4_4_ = auVar43._4_4_ * 0.99999964;
                auVar37._8_4_ = auVar43._8_4_ * 0.99999964;
                auVar37._12_4_ = auVar43._12_4_ * 0.99999964;
                auVar43 = vpmaxsd_avx(auVar37,(undefined1  [16])tray.tnear.field_0);
                auVar46._0_4_ = auVar40._0_4_ * 1.0000004;
                auVar46._4_4_ = auVar40._4_4_ * 1.0000004;
                auVar46._8_4_ = auVar40._8_4_ * 1.0000004;
                auVar46._12_4_ = auVar40._12_4_ * 1.0000004;
                auVar40 = vpminsd_avx(auVar46,(undefined1  [16])tray.tfar.field_0);
              }
              auVar40 = vcmpps_avx(auVar43,auVar40,2);
              auVar50._8_8_ = 0x100000001;
              auVar50._0_8_ = 0x100000001;
              sVar18 = sVar27;
              auVar43 = auVar54;
              if ((auVar50 & auVar40) != (undefined1  [16])0x0) {
                auVar43 = vpslld_avx(auVar40,0x1f);
                auVar43 = vblendvps_avx(auVar99._0_16_,auVar37,auVar43);
                sVar18 = sVar3;
                if (sVar27 != 8) {
                  pNVar30->ptr = sVar27;
                  pNVar30 = pNVar30 + 1;
                  *(undefined1 (*) [16])paVar29->v = auVar54;
                  paVar29 = paVar29 + 1;
                }
              }
              auVar54 = auVar43;
              sVar27 = sVar18;
            }
            if (sVar27 == 8) goto LAB_01646b42;
            auVar43 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar54,6);
            uVar22 = vmovmskps_avx(auVar43);
            root.ptr = sVar27;
          } while ((byte)uVar24 < (byte)POPCOUNT(uVar22));
          pNVar30->ptr = sVar27;
          pNVar30 = pNVar30 + 1;
          *(undefined1 (*) [16])paVar29->v = auVar54;
          paVar29 = paVar29 + 1;
LAB_01646b42:
          iVar23 = 4;
        }
        else {
          while (uVar25 != 0) {
            sVar27 = 0;
            for (uVar28 = uVar25; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
              sVar27 = sVar27 + 1;
            }
            uVar25 = uVar25 - 1 & uVar25;
            bVar20 = occluded1(This,bvh,root,sVar27,&pre,ray,&tray,context);
            if (bVar20) {
              terminated.field_0.i[sVar27] = -1;
            }
          }
          auVar54 = _DAT_01f46b70 & ~(undefined1  [16])terminated.field_0;
          iVar23 = 3;
          auVar99 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar100 = ZEXT1664((undefined1  [16])vVar1.field_0);
          if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar54[0xf] < '\0') {
            auVar54._8_4_ = 0xff800000;
            auVar54._0_8_ = 0xff800000ff800000;
            auVar54._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar54,
                               (undefined1  [16])terminated.field_0);
            iVar23 = 2;
          }
          if (uVar24 < uVar21) goto LAB_016467b7;
        }
      } while (iVar23 != 3);
LAB_01646d4f:
      auVar54 = vandps_avx(auVar47,(undefined1  [16])terminated.field_0);
      auVar47._8_4_ = 0xff800000;
      auVar47._0_8_ = 0xff800000ff800000;
      auVar47._12_4_ = 0xff800000;
      auVar54 = vmaskmovps_avx(auVar54,auVar47);
      *(undefined1 (*) [16])(ray + 0x80) = auVar54;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }